

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<float>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<float> *out)

{
  uint uVar1;
  int iVar2;
  pointer pfVar3;
  char *pcVar4;
  LogMessage *this_00;
  int n;
  string_view str;
  RepeatedField<float> *local_50;
  int local_44;
  LogMessage local_40;
  
  if (ptr == (char *)0x0) {
LAB_00248dac:
    pcVar4 = (char *)0x0;
  }
  else {
    local_50 = out;
    uVar1 = BytesAvailable(this,ptr);
    if ((int)uVar1 < size) {
      do {
        iVar2 = SooRep::size(&out->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(out->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
        RepeatedField<float>::Reserve(out,iVar2 + ((int)uVar1 >> 2));
        pfVar3 = RepeatedField<float>::AddNAlreadyReserved(out,(int)uVar1 >> 2);
        memcpy(pfVar3,ptr,(long)(int)(uVar1 & 0xfffffffc));
        if ((this->limit_ < 0x11) || (pcVar4 = Next(this), pcVar4 == (char *)0x0))
        goto LAB_00248dac;
        size = size - (uVar1 & 0xfffffffc);
        ptr = pcVar4 + (0x10 - (uVar1 & 3));
        uVar1 = BytesAvailable(this,ptr);
      } while ((int)uVar1 < size);
    }
    uVar1 = size & 0xfffffffc;
    if (3 < (uint)size) {
      n = size >> 2;
      iVar2 = SooRep::size(&out->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(out->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
      RepeatedField<float>::Reserve(out,iVar2 + n);
      pfVar3 = RepeatedField<float>::AddNAlreadyReserved(out,n);
      if (pfVar3 == (pointer)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x4ea,"dst != nullptr");
        this_00 = absl::lts_20250127::log_internal::LogMessage::
                  operator<<<google::protobuf::RepeatedField<float>_*,_0>(&local_40,&local_50);
        str._M_str = ",";
        str._M_len = 1;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str);
        local_44 = n;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_00,&local_44);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      memcpy(pfVar3,ptr,(long)(int)uVar1);
      ptr = ptr + (int)uVar1;
    }
    pcVar4 = (char *)0x0;
    if (size == uVar1) {
      pcVar4 = ptr;
    }
  }
  return pcVar4;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = BytesAvailable(ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = BytesAvailable(ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}